

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::Id<mathiu::impl::RelationalKind>::Id
          (Id<mathiu::impl::RelationalKind> *this,Id<mathiu::impl::RelationalKind> *id)

{
  BlockT *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  __index_type local_38;
  IdBlockBase<mathiu::impl::RelationalKind> local_30;
  Id<mathiu::impl::RelationalKind> *local_18;
  Id<mathiu::impl::RelationalKind> *id_local;
  Id<mathiu::impl::RelationalKind> *this_local;
  
  local_18 = id;
  id_local = this;
  IdBlockBase<mathiu::impl::RelationalKind>::IdBlockBase(&local_30);
  std::
  variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,matchit::impl::IdBlock<mathiu::impl::RelationalKind>*>
  ::
  variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,void,void,matchit::impl::IdBlock<mathiu::impl::RelationalKind>,void>
            ((variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,matchit::impl::IdBlock<mathiu::impl::RelationalKind>*>
              *)this,(IdBlock<mathiu::impl::RelationalKind> *)&local_30);
  local_58 = block(local_18);
  std::
  variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,matchit::impl::IdBlock<mathiu::impl::RelationalKind>*>
  ::
  variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>*,void,void,matchit::impl::IdBlock<mathiu::impl::RelationalKind>*,void>
            ((variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,matchit::impl::IdBlock<mathiu::impl::RelationalKind>*>
              *)&local_50,&local_58);
  *(undefined8 *)
   &(this->mBlock).
    super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
       = local_50;
  *(undefined8 *)
   ((long)&(this->mBlock).
           super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
   + 8) = local_48;
  *(undefined8 *)
   ((long)&(this->mBlock).
           super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
   + 0x10) = local_40;
  *(__index_type *)
   ((long)&(this->mBlock).
           super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
   + 0x18) = local_38;
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }